

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

_Bool art_erase(art_t *art,art_key_chunk_t *key,art_val_t *erased_val)

{
  undefined8 *in_RDX;
  long *in_RDI;
  art_erase_result_t result;
  art_val_t erased_val_local;
  art_t *in_stack_00000040;
  long local_40;
  byte local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 *local_20;
  long *local_10;
  _Bool local_1;
  
  local_20 = in_RDX;
  if (in_RDX == (undefined8 *)0x0) {
    local_20 = &local_28;
  }
  if (*in_RDI == 0) {
    local_1 = false;
  }
  else {
    local_10 = in_RDI;
    art_erase_at(in_stack_00000040,(art_ref_t)art,key,erased_val._7_1_);
    if ((local_38 & 1) == 0) {
      local_1 = false;
    }
    else {
      *local_10 = local_40;
      *local_20 = local_30;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool art_erase(art_t *art, const art_key_chunk_t *key, art_val_t *erased_val) {
    art_val_t erased_val_local;
    if (erased_val == NULL) {
        erased_val = &erased_val_local;
    }
    if (art->root == CROARING_ART_NULL_REF) {
        return false;
    }
    art_erase_result_t result = art_erase_at(art, art->root, key, 0);
    if (!result.erased) {
        return false;
    }
    art->root = result.rootmost_node;
    *erased_val = result.value_erased;
    return true;
}